

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

SystemSubroutine * __thiscall
slang::ast::Compilation::getSystemMethod(Compilation *this,SymbolKind typeKind,string_view name)

{
  value_type_pointer __u;
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  bool bVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  size_t seed;
  size_t local_50;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind> local_48;
  
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = name._M_str;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = name._M_len;
  local_50 = 0;
  local_48.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>
  .super__Tuple_impl<1UL,_slang::ast::SymbolKind>.
  super__Head_base<1UL,_slang::ast::SymbolKind,_false>._M_head_impl =
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)
       (_Head_base<1UL,_slang::ast::SymbolKind,_false>)typeKind;
  slang::detail::hashing::
  HashValueImpl<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_1UL>
  ::apply(&local_50,&local_48);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_50;
  uVar17 = SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,8) ^
           SUB168(ZEXT816(0x9e3779b97f4a7c15) * auVar6,0);
  uVar15 = uVar17 >> ((byte)(this->methodMap).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar16 = (uVar17 & 0xff) * 4;
  uVar7 = (&UNK_0092f4ac)[lVar16];
  uVar8 = (&UNK_0092f4ad)[lVar16];
  uVar9 = (&UNK_0092f4ae)[lVar16];
  bVar10 = (&UNK_0092f4af)[lVar16];
  uVar14 = 0;
  do {
    pgVar2 = (this->methodMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar15;
    bVar12 = pgVar1->m[0xf].n;
    auVar18[0] = -(pgVar1->m[0].n == uVar7);
    auVar18[1] = -(pgVar1->m[1].n == uVar8);
    auVar18[2] = -(pgVar1->m[2].n == uVar9);
    auVar18[3] = -(pgVar1->m[3].n == bVar10);
    auVar18[4] = -(pgVar1->m[4].n == uVar7);
    auVar18[5] = -(pgVar1->m[5].n == uVar8);
    auVar18[6] = -(pgVar1->m[6].n == uVar9);
    auVar18[7] = -(pgVar1->m[7].n == bVar10);
    auVar18[8] = -(pgVar1->m[8].n == uVar7);
    auVar18[9] = -(pgVar1->m[9].n == uVar8);
    auVar18[10] = -(pgVar1->m[10].n == uVar9);
    auVar18[0xb] = -(pgVar1->m[0xb].n == bVar10);
    auVar18[0xc] = -(pgVar1->m[0xc].n == uVar7);
    auVar18[0xd] = -(pgVar1->m[0xd].n == uVar8);
    auVar18[0xe] = -(pgVar1->m[0xe].n == uVar9);
    auVar18[0xf] = -(bVar12 == bVar10);
    uVar13 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar13 != 0) {
      ppVar3 = (this->methodMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               .arrays.elements_;
      do {
        uVar5 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
          }
        }
        __u = ppVar3 + uVar15 * 0xf + (ulong)uVar5;
        bVar11 = std::
                 __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::SymbolKind>,_0UL,_2UL>
                 ::__eq(&local_48,&__u->first);
        if (bVar11) {
          return (__u->second).
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
        }
        uVar13 = uVar13 - 1 & uVar13;
      } while (uVar13 != 0);
      bVar12 = pgVar2[uVar15].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar17 & 7] & bVar12) == 0) {
      return (SystemSubroutine *)0x0;
    }
    uVar4 = (this->methodMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_slang::ast::SymbolKind>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.groups_size_mask;
    lVar16 = uVar15 + uVar14;
    uVar14 = uVar14 + 1;
    uVar15 = lVar16 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  return (SystemSubroutine *)0x0;
}

Assistant:

const SystemSubroutine* Compilation::getSystemMethod(SymbolKind typeKind,
                                                     std::string_view name) const {
    auto it = methodMap.find(std::make_tuple(name, typeKind));
    if (it == methodMap.end())
        return nullptr;
    return it->second.get();
}